

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O3

int sort_5_4::insert_b_sort_1(int *a,int n)

{
  int iVar1;
  int i;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = 0;
  do {
    iVar1 = a[uVar2];
    if (uVar2 == 0) {
      uVar4 = 0;
    }
    else {
      iVar3 = (int)uVar2 + -1;
      uVar7 = 0;
      do {
        uVar6 = uVar7 + iVar3 >> 1;
        if (iVar1 < a[uVar6]) {
          uVar7 = uVar6 + 1;
        }
        else {
          iVar3 = uVar6 - 1;
        }
      } while ((int)uVar7 <= iVar3);
      uVar4 = (ulong)uVar7;
    }
    uVar5 = uVar2;
    if (uVar4 < uVar2) {
      do {
        a[uVar5] = a[uVar5 - 1];
        uVar5 = uVar5 - 1;
      } while ((long)uVar4 < (long)uVar5);
    }
    a[uVar4] = iVar1;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int insert_b_sort_1(int *a, int n) {
        int mid, low, high, t;
        for (int i = 0; i < n; i++) {
            low = 0, high = i - 1, t = a[i];
            while (low <= high) {
                mid = (low + high) / 2;
//                if (t < a[mid])
//                    high = mid - 1;
//                else
//                    low = mid + 1;
                if (t < a[mid])
                    low = mid + 1;
                else
                    high = mid - 1;
            }

            for (int j = i - 1; j >= low; j--)
                a[j + 1] = a[j];
            a[low] = t;
        }
    }